

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int ypos;
  int xpos;
  int local_20;
  int local_1c;
  
  if (action == 1) {
    if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
      return;
    }
    if (key == 0x20) {
      glfwGetWindowPos(window,&local_1c,&local_20);
      glfwSetWindowPos(window,local_1c,local_20);
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_SPACE:
        {
            int xpos, ypos;
            glfwGetWindowPos(window, &xpos, &ypos);
            glfwSetWindowPos(window, xpos, ypos);
            break;
        }

        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
    }
}